

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O3

void __thiscall amrex::MLMG::makeSolvable(MLMG *this)

{
  ostringstream *this_00;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  void *local_1d0;
  long local_1c8;
  long local_1c0;
  Print local_1b8;
  
  (*this->linop->_vptr_MLLinOp[0x1b])
            (&local_1d0,this->linop,0,0,
             (this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((3 < this->verbose) &&
     (uVar2 = (uint)((ulong)(local_1c8 - (long)local_1d0) >> 3), 0 < (int)uVar2)) {
    this_00 = &local_1b8.ss;
    uVar3 = 0;
    do {
      local_1b8.os = OutStream();
      local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
      local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"MLMG: Subtracting ",0x12);
      std::ostream::_M_insert<double>(*(double *)((long)local_1d0 + uVar3 * 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," from rhs component ",0x14);
      std::ostream::operator<<(this_00,(int)uVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
      Print::~Print(&local_1b8);
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
  }
  if (0 < this->namrlevs) {
    lVar1 = 0;
    uVar3 = 0;
    do {
      (*this->linop->_vptr_MLLinOp[0x1c])
                (this->linop,uVar3 & 0xffffffff,0,
                 (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar1,&local_1d0);
      uVar3 = uVar3 + 1;
      lVar1 = lVar1 + 8;
    } while ((long)uVar3 < (long)this->namrlevs);
  }
  if (local_1d0 != (void *)0x0) {
    operator_delete(local_1d0,local_1c0 - (long)local_1d0);
  }
  return;
}

Assistant:

void
MLMG::makeSolvable ()
{
    auto const& offset = linop.getSolvabilityOffset(0, 0, rhs[0]);
    if (verbose >= 4) {
        const int ncomp = offset.size();
        for (int c = 0; c < ncomp; ++c) {
            amrex::Print() << "MLMG: Subtracting " << offset[c] << " from rhs component "
                           << c << "\n";
        }
    }
    for (int alev = 0; alev < namrlevs; ++alev) {
        linop.fixSolvabilityByOffset(alev, 0, rhs[alev], offset);
    }
}